

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall leveldb::BlockHandle::EncodeTo(BlockHandle *this,string *dst)

{
  long lVar1;
  uint __line;
  char *__assertion;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->offset_ == 0xffffffffffffffff) {
    __assertion = "offset_ != ~static_cast<uint64_t>(0)";
    __line = 0x11;
  }
  else {
    if (this->size_ != 0xffffffffffffffff) {
      PutVarint64(dst,this->offset_);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        PutVarint64(dst,this->size_);
        return;
      }
      __stack_chk_fail();
    }
    __assertion = "size_ != ~static_cast<uint64_t>(0)";
    __line = 0x12;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/format.cc"
                ,__line,"void leveldb::BlockHandle::EncodeTo(std::string *) const");
}

Assistant:

void BlockHandle::EncodeTo(std::string* dst) const {
  // Sanity check that all fields have been set
  assert(offset_ != ~static_cast<uint64_t>(0));
  assert(size_ != ~static_cast<uint64_t>(0));
  PutVarint64(dst, offset_);
  PutVarint64(dst, size_);
}